

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

void __thiscall r_exec::Group::inject_secondary_mdl_controller(Group *this,View *view)

{
  PrimaryMDLController *this_00;
  View *this_01;
  mapped_type *this_02;
  SecondaryMDLController *this_03;
  View *local_30;
  
  this_00 = (PrimaryMDLController *)(view->controller).object;
  this_01 = (View *)operator_new(0x100);
  View::View(this_01,view,true);
  r_code::Atom::Float(0.0);
  r_code::Atom::operator=((Atom *)&(this_01->super_View).field_0x44,(Atom *)&local_30);
  r_code::Atom::~Atom((Atom *)&local_30);
  (this_01->super_View).references[0] = (Code *)this;
  local_30 = (View *)View::get_oid(this_01);
  this_02 = std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->ipgm_views,(key_type *)&local_30);
  core::P<r_exec::View>::operator=(this_02,this_01);
  this_03 = (SecondaryMDLController *)operator_new(0x440);
  SecondaryMDLController::SecondaryMDLController(this_03,(View *)this_01);
  core::P<r_exec::Controller>::operator=(&this_01->controller,(Controller *)this_03);
  local_30 = this_01;
  std::__detail::
  _Insert<r_code::View_*,_r_code::View_*,_std::allocator<r_code::View_*>,_std::__detail::_Identity,_r_code::View::Equal,_r_code::View::Hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
  ::insert((_Insert<r_code::View_*,_r_code::View_*,_std::allocator<r_code::View_*>,_std::__detail::_Identity,_r_code::View::Equal,_r_code::View::Hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
            *)&(view->super_View).object.object[5].refCount,(value_type *)&local_30);
  PrimaryMDLController::set_secondary(this_00,this_03);
  SecondaryMDLController::set_primary(this_03,this_00);
  return;
}

Assistant:

void Group::inject_secondary_mdl_controller(View *view)
{
    PrimaryMDLController *p = (PrimaryMDLController *)view->controller;
    View *_view = new View(view, true);
    _view->code(VIEW_ACT) = Atom::Float(0);
    _view->references[0] = this;
    ipgm_views[_view->get_oid()] = _view;
    SecondaryMDLController *s = new SecondaryMDLController(_view);
    _view->controller = s;
    view->object->views.insert(_view);
    p->set_secondary(s);
    s->set_primary(p);
}